

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestWithCustomGenerator.cpp
# Opt level: O1

vector<Rectangle,_std::allocator<Rectangle>_> * __thiscall
CustomGenerator::shrink
          (vector<Rectangle,_std::allocator<Rectangle>_> *__return_storage_ptr__,
          CustomGenerator *this,Rectangle *r)

{
  pointer *ppRVar1;
  iterator iVar2;
  Rectangle local_18;
  
  (__return_storage_ptr__->super__Vector_base<Rectangle,_std::allocator<Rectangle>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Rectangle,_std::allocator<Rectangle>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Rectangle,_std::allocator<Rectangle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (1 < r->width) {
    local_18.height = r->height;
    local_18.width = r->width + -1;
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<Rectangle,_std::allocator<Rectangle>_>)._M_impl
         .super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<Rectangle,_std::allocator<Rectangle>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Rectangle,_std::allocator<Rectangle>_>::_M_realloc_insert<Rectangle>
                (__return_storage_ptr__,iVar2,&local_18);
    }
    else {
      *iVar2._M_current = local_18;
      ppRVar1 = &(__return_storage_ptr__->super__Vector_base<Rectangle,_std::allocator<Rectangle>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppRVar1 = *ppRVar1 + 1;
    }
  }
  if (1 < r->height) {
    local_18.height = r->height + -1;
    local_18.width = r->width;
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<Rectangle,_std::allocator<Rectangle>_>)._M_impl
         .super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<Rectangle,_std::allocator<Rectangle>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Rectangle,_std::allocator<Rectangle>_>::_M_realloc_insert<Rectangle>
                (__return_storage_ptr__,iVar2,&local_18);
    }
    else {
      *iVar2._M_current = local_18;
      ppRVar1 = &(__return_storage_ptr__->super__Vector_base<Rectangle,_std::allocator<Rectangle>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppRVar1 = *ppRVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Rectangle> shrink(const Rectangle& r) {
    std::vector<Rectangle> ret;
    if (r.getWidth() > 1)
      ret.push_back(Rectangle(r.getWidth() - 1, r.getHeight()));
    if (r.getHeight() > 1) {
      ret.push_back(Rectangle(r.getWidth(), r.getHeight() - 1));
    }
    return ret;
  }